

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall
QTextOdfWriter::writeTableFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextTableFormat *format,int formatIndex)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Int IVar3;
  Type TVar4;
  qsizetype qVar5;
  const_reference pQVar6;
  QStringBuilder<QString,_QLatin1String> *in_RSI;
  long in_FS_OFFSET;
  qreal qVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QTextLength QVar26;
  int colit;
  QString columnWidth;
  char *align;
  undefined8 in_stack_fffffffffffff748;
  int iVar28;
  QTextTableFormat *this_00;
  QStringBuilder<QString,_QLatin1String> *pQVar27;
  undefined8 in_stack_fffffffffffff750;
  QLatin1String *pQVar29;
  QStringBuilder<QString,_QLatin1String> *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  Type in_stack_fffffffffffff764;
  QSet<int> *in_stack_fffffffffffff768;
  QChar fillChar;
  int local_7f4;
  QTextTableFormat *local_7d8;
  QLatin1String *local_7d0;
  storage_type *local_7c8;
  undefined1 local_7b8 [40];
  QAnyStringView *local_790;
  QAnyStringView *local_788;
  QLatin1StringView local_780;
  QList<QTextLength> local_770;
  undefined1 local_758 [88];
  QLatin1StringView local_700;
  undefined1 local_6d8 [112];
  QLatin1StringView local_668;
  undefined1 local_640 [112];
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  storage_type *local_5b8;
  undefined1 local_5a8 [40];
  QAnyStringView *local_580;
  storage_type *local_570;
  undefined1 local_560 [24];
  QStringBuilder<QString,_QLatin1String> *local_548;
  QLatin1String *local_540;
  storage_type *local_538;
  undefined1 local_528 [40];
  QAnyStringView *local_500;
  QAnyStringView *local_4f8;
  QChar local_4ec;
  QChar local_4ea;
  storage_type *local_4e8;
  undefined1 local_4d8 [88];
  storage_type *local_480;
  undefined1 local_470 [40];
  QAnyStringView *local_448;
  QAnyStringView *local_440;
  storage_type *local_438;
  undefined1 local_428 [40];
  QAnyStringView *local_400;
  QList<QTextLength> local_3f0;
  QList<QTextLength> local_3c8 [2];
  QLatin1StringView local_398;
  QTextLength local_388;
  undefined1 local_378 [64];
  QTextTableFormat *local_338;
  QLatin1String *local_330;
  storage_type *local_328;
  undefined1 local_318 [40];
  QAnyStringView *local_2f0;
  QAnyStringView *local_2e8;
  QTextLength local_2e0;
  storage_type *local_2d0;
  undefined1 local_2c0 [24];
  QTextTableFormat *local_2a8;
  QLatin1String *local_2a0;
  storage_type *local_298;
  undefined1 local_288 [40];
  QAnyStringView *local_260;
  QAnyStringView *local_258;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_24c;
  char *local_248;
  storage_type *local_240;
  undefined1 local_230 [24];
  QTextTableFormat *local_218;
  QLatin1String *local_210;
  storage_type *local_208;
  undefined1 local_1f8 [40];
  QAnyStringView *local_1d0;
  QAnyStringView *local_1c8;
  storage_type *local_1c0;
  undefined1 local_1b0 [40];
  QAnyStringView *local_188;
  storage_type *local_178;
  undefined1 local_168 [24];
  QTextTableFormat *local_150;
  QLatin1String *local_148;
  storage_type *local_140;
  undefined1 local_130 [40];
  QAnyStringView *local_108;
  QAnyStringView *local_100;
  QChar local_f2;
  storage_type *local_f0;
  undefined1 local_e0 [64];
  storage_type *local_a0;
  undefined1 local_90 [40];
  QAnyStringView *local_68;
  QAnyStringView *local_60;
  storage_type *local_58;
  undefined1 local_48 [40];
  QAnyStringView *local_20;
  long local_8;
  
  iVar28 = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QByteArrayView::QByteArrayView<6ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [6])in_stack_fffffffffffff758);
  QVar8.m_data = local_58;
  QVar8.m_size = (qsizetype)local_48;
  QString::fromLatin1(QVar8);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)in_RSI,local_20);
  QString::~QString((QString *)0x9f27f4);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QByteArrayView::QByteArrayView<5ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [5])in_stack_fffffffffffff758);
  QVar9.m_data = local_a0;
  QVar9.m_size = (qsizetype)local_90;
  QString::fromLatin1(QVar9);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QByteArrayView::QByteArrayView<8ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [8])in_stack_fffffffffffff758);
  QVar10.m_data = local_f0;
  QVar10.m_size = (qsizetype)local_e0;
  QString::fromLatin1(QVar10);
  QChar::QChar<char16_t,_true>(&local_f2,L' ');
  QString::arg<int,_true>
            (&in_stack_fffffffffffff758->a,(int)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (int)in_stack_fffffffffffff750,iVar28,
             (QChar)(char16_t)((ulong)in_stack_fffffffffffff768 >> 0x30));
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_68,local_60);
  QString::~QString((QString *)0x9f2948);
  QString::~QString((QString *)0x9f2955);
  QString::~QString((QString *)0x9f2962);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QByteArrayView::QByteArrayView<7ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [7])in_stack_fffffffffffff758);
  QVar11.m_data = local_140;
  QVar11.m_size = (qsizetype)local_130;
  QString::fromLatin1(QVar11);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QByteArrayView::QByteArrayView<6ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [6])in_stack_fffffffffffff758);
  QVar12.m_data = local_178;
  QVar12.m_size = (qsizetype)local_168;
  QString::fromLatin1(QVar12);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_108,local_100);
  QString::~QString((QString *)0x9f2a69);
  QString::~QString((QString *)0x9f2a76);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QByteArrayView::QByteArrayView<17ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [17])in_stack_fffffffffffff758);
  QVar13.m_data = local_1c0;
  QVar13.m_size = (qsizetype)local_1b0;
  QString::fromLatin1(QVar13);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             &in_stack_fffffffffffff758->a);
  QXmlStreamWriter::writeEmptyElement((QAnyStringView *)in_RSI,local_188);
  QString::~QString((QString *)0x9f2b1f);
  bVar2 = QSet<int>::contains((QSet<int> *)local_148,(int *)local_150);
  this_00 = local_150;
  pQVar29 = local_148;
  if (bVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QByteArrayView::QByteArrayView<13ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [13])in_stack_fffffffffffff758);
    QVar14.m_data = local_208;
    QVar14.m_size = (qsizetype)local_1f8;
    QString::fromLatin1(QVar14);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QByteArrayView::QByteArrayView<11ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [11])in_stack_fffffffffffff758);
    QVar15.m_data = local_240;
    QVar15.m_size = (qsizetype)local_230;
    QString::fromLatin1(QVar15);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_1d0,local_1c8);
    QString::~QString((QString *)0x9f2c4b);
    QString::~QString((QString *)0x9f2c58);
    this_00 = local_218;
    pQVar29 = local_210;
  }
  local_248 = (char *)0x0;
  local_24c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)QTextTableFormat::alignment((QTextTableFormat *)pQVar29);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24c);
  switch(IVar3) {
  case 1:
    local_248 = "left";
    break;
  case 2:
    local_248 = "right";
    break;
  case 4:
    local_248 = "center";
    break;
  case 8:
    local_248 = "margins";
  }
  if (local_248 != (char *)0x0) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QByteArrayView::QByteArrayView<6ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [6])in_stack_fffffffffffff758);
    QVar16.m_data = local_298;
    QVar16.m_size = (qsizetype)local_288;
    QString::fromLatin1(QVar16);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char **)in_stack_fffffffffffff758);
    QVar17.m_data = local_2d0;
    QVar17.m_size = (qsizetype)local_2c0;
    QString::fromLatin1(QVar17);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_260,local_258);
    QString::~QString((QString *)0x9f2dfc);
    QString::~QString((QString *)0x9f2e09);
    this_00 = local_2a8;
    pQVar29 = local_2a0;
  }
  QVar26 = QTextFrameFormat::width((QTextFrameFormat *)0x9f2e16);
  local_2e0.fixedValueOrPercentage = QVar26.fixedValueOrPercentage;
  local_2e0.lengthType = QVar26.lengthType;
  qVar7 = QTextLength::rawValue(&local_2e0);
  if ((qVar7 != 0.0) || (NAN(qVar7))) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QByteArrayView::QByteArrayView<6ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [6])in_stack_fffffffffffff758);
    QVar18.m_data = local_328;
    QVar18.m_size = (qsizetype)local_318;
    QString::fromLatin1(QVar18);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               &in_stack_fffffffffffff758->a);
    QVar26 = QTextFrameFormat::width((QTextFrameFormat *)0x9f2ebc);
    local_388.fixedValueOrPercentage = QVar26.fixedValueOrPercentage;
    local_388.lengthType = QVar26.lengthType;
    qVar7 = QTextLength::rawValue(&local_388);
    QString::number(qVar7,(char)local_378,0x67);
    local_398 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff758,(size_t)pQVar29);
    ::operator+(&in_stack_fffffffffffff758->a,pQVar29);
    QString::QString((QString *)0x9f2f3b);
    QAnyStringView::QAnyStringView<QStringBuilder<QString,_QLatin1String>,_true>
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               in_stack_fffffffffffff758,
               (wrapped_t<QStringBuilder<QString,_QLatin1String>,_QString> *)pQVar29);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_2f0,local_2e8);
    QString::~QString((QString *)0x9f2fa7);
    QStringBuilder<QString,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1String> *)0x9f2fb4);
    QString::~QString((QString *)0x9f2fc1);
    QString::~QString((QString *)0x9f2fce);
    this_00 = local_338;
    pQVar29 = local_330;
  }
  QXmlStreamWriter::writeEndElement();
  QTextTableFormat::columnWidthConstraints(this_00);
  qVar5 = QList<QTextLength>::size(local_3c8);
  QList<QTextLength>::~QList((QList<QTextLength> *)0x9f300f);
  if (qVar5 != 0) {
    QSet<int>::insert(in_stack_fffffffffffff768,
                      (int *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_7f4 = 0;
    while( true ) {
      QTextTableFormat::columnWidthConstraints(this_00);
      iVar28 = (int)((ulong)this_00 >> 0x20);
      qVar5 = QList<QTextLength>::size(&local_3f0);
      QList<QTextLength>::~QList((QList<QTextLength> *)0x9f308e);
      if (qVar5 <= local_7f4) break;
      pQVar27 = in_RSI;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QByteArrayView::QByteArrayView<6ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [6])in_stack_fffffffffffff758);
      QVar19.m_data = local_438;
      QVar19.m_size = (qsizetype)local_428;
      QString::fromLatin1(QVar19);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QXmlStreamWriter::writeStartElement((QAnyStringView *)pQVar27,local_400);
      fillChar.ucs = (char16_t)((ulong)pQVar27 >> 0x30);
      QString::~QString((QString *)0x9f3144);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [5])in_stack_fffffffffffff758);
      QVar20.m_data = local_480;
      QVar20.m_size = (qsizetype)local_470;
      QString::fromLatin1(QVar20);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QByteArrayView::QByteArrayView<11ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [11])in_stack_fffffffffffff758);
      QVar21.m_data = local_4e8;
      QVar21.m_size = (qsizetype)local_4d8;
      QString::fromLatin1(QVar21);
      QChar::QChar<char16_t,_true>(&local_4ea,L' ');
      QString::arg<int,_true>
                (&in_stack_fffffffffffff758->a,(int)((ulong)pQVar29 >> 0x20),(int)pQVar29,iVar28,
                 fillChar);
      QChar::QChar<char16_t,_true>(&local_4ec,L' ');
      QString::arg<int,_true>
                (&in_stack_fffffffffffff758->a,(int)((ulong)pQVar29 >> 0x20),(int)pQVar29,iVar28,
                 fillChar);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_448,local_440);
      QString::~QString((QString *)0x9f32d3);
      QString::~QString((QString *)0x9f32e0);
      QString::~QString((QString *)0x9f32ed);
      QString::~QString((QString *)0x9f32fa);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QByteArrayView::QByteArrayView<7ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [7])in_stack_fffffffffffff758);
      QVar22.m_data = local_538;
      QVar22.m_size = (qsizetype)local_528;
      QString::fromLatin1(QVar22);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QByteArrayView::QByteArrayView<13ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [13])in_stack_fffffffffffff758);
      QVar23.m_data = local_570;
      QVar23.m_size = (qsizetype)local_560;
      QString::fromLatin1(QVar23);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      pQVar27 = local_548;
      pQVar29 = local_540;
      QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_500,local_4f8);
      QString::~QString((QString *)0x9f33fb);
      QString::~QString((QString *)0x9f3408);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QByteArrayView::QByteArrayView<24ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [24])in_stack_fffffffffffff758);
      QVar24.m_data = local_5b8;
      QVar24.m_size = (qsizetype)local_5a8;
      QString::fromLatin1(QVar24);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QXmlStreamWriter::writeEmptyElement((QAnyStringView *)in_RSI,local_580);
      QString::~QString((QString *)0x9f34ab);
      local_5d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_5c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_5c0 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x9f34e5);
      QTextTableFormat::columnWidthConstraints((QTextTableFormat *)pQVar27);
      pQVar6 = QList<QTextLength>::at((QList<QTextLength> *)pQVar29,(qsizetype)pQVar27);
      TVar4 = QTextLength::type(pQVar6);
      QList<QTextLength>::~QList((QList<QTextLength> *)0x9f3528);
      if (TVar4 == PercentageLength) {
        QTextTableFormat::columnWidthConstraints((QTextTableFormat *)pQVar27);
        pQVar6 = QList<QTextLength>::at((QList<QTextLength> *)pQVar29,(qsizetype)pQVar27);
        qVar7 = QTextLength::rawValue(pQVar6);
        QString::number(qVar7,(char)local_640,0x67);
        local_668 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff758,(size_t)pQVar29);
        ::operator+(&in_stack_fffffffffffff758->a,pQVar29);
        ::QStringBuilder::operator_cast_to_QString(pQVar27);
        QString::operator=((QString *)pQVar29,&pQVar27->a);
        QString::~QString((QString *)0x9f35f3);
        QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                  ((QStringBuilder<QString,_QLatin1String> *)0x9f3600);
        QString::~QString((QString *)0x9f360d);
        QList<QTextLength>::~QList((QList<QTextLength> *)0x9f361a);
      }
      else {
        QTextTableFormat::columnWidthConstraints((QTextTableFormat *)pQVar27);
        pQVar6 = QList<QTextLength>::at((QList<QTextLength> *)pQVar29,(qsizetype)pQVar27);
        in_stack_fffffffffffff764 = QTextLength::type(pQVar6);
        QList<QTextLength>::~QList((QList<QTextLength> *)0x9f3662);
        if (in_stack_fffffffffffff764 == FixedLength) {
          QTextTableFormat::columnWidthConstraints((QTextTableFormat *)pQVar27);
          pQVar6 = QList<QTextLength>::at((QList<QTextLength> *)pQVar29,(qsizetype)pQVar27);
          qVar7 = QTextLength::rawValue(pQVar6);
          QString::number(qVar7,(char)local_6d8,0x67);
          local_700 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff758,(size_t)pQVar29);
          ::operator+(&in_stack_fffffffffffff758->a,pQVar29);
          ::QStringBuilder::operator_cast_to_QString(pQVar27);
          QString::operator=((QString *)pQVar29,&pQVar27->a);
          QString::~QString((QString *)0x9f372d);
          QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                    ((QStringBuilder<QString,_QLatin1String> *)0x9f373a);
          QString::~QString((QString *)0x9f3747);
          QList<QTextLength>::~QList((QList<QTextLength> *)0x9f3754);
        }
        else {
          QTextTableFormat::columnWidthConstraints((QTextTableFormat *)pQVar27);
          qVar5 = QList<QTextLength>::size(&local_770);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = SUB168(SEXT816(100),8);
          QString::number((longlong)local_758,
                          SUB164((auVar1 << 0x40 | ZEXT816(100)) / SEXT816(qVar5),0));
          local_780 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff758,(size_t)pQVar29);
          ::operator+(&in_stack_fffffffffffff758->a,pQVar29);
          ::QStringBuilder::operator_cast_to_QString(pQVar27);
          QString::operator=((QString *)pQVar29,&pQVar27->a);
          QString::~QString((QString *)0x9f3812);
          QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                    ((QStringBuilder<QString,_QLatin1String> *)0x9f381f);
          QString::~QString((QString *)0x9f382c);
          QList<QTextLength>::~QList((QList<QTextLength> *)0x9f3839);
        }
      }
      in_stack_fffffffffffff758 = in_RSI;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_RSI->a);
      QByteArrayView::QByteArrayView<13ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [13])in_stack_fffffffffffff758);
      QVar25.m_data = local_7c8;
      QVar25.m_size = (qsizetype)local_7b8;
      QString::fromLatin1(QVar25);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 &in_stack_fffffffffffff758->a);
      this_00 = local_7d8;
      pQVar29 = local_7d0;
      QXmlStreamWriter::writeAttribute
                ((QAnyStringView *)in_stack_fffffffffffff758,local_790,local_788);
      QString::~QString((QString *)0x9f390b);
      QXmlStreamWriter::writeEndElement();
      QString::~QString((QString *)0x9f3925);
      local_7f4 = local_7f4 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::writeTableFormat(QXmlStreamWriter &writer, QTextTableFormat format, int formatIndex) const
{
    // start writing table style element
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                          QString::fromLatin1("Table%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("table-properties"));

    if (m_tableFormatsWithBorders.contains(formatIndex)) {
        // write border format collapsing to table style
        writer.writeAttribute(tableNS, QString::fromLatin1("border-model"),
                              QString::fromLatin1("collapsing"));
    }
    const char* align = nullptr;
    switch (format.alignment()) {
    case Qt::AlignLeft:
        align = "left";
        break;
    case Qt::AlignRight:
        align = "right";
        break;
    case Qt::AlignHCenter:
        align = "center";
        break;
    case Qt::AlignJustify:
        align = "margins";
        break;
    }
    if (align)
       writer.writeAttribute(tableNS, QString::fromLatin1("align"), QString::fromLatin1(align));
    if (format.width().rawValue()) {
        writer.writeAttribute(styleNS, QString::fromLatin1("width"),
                              QString::number(format.width().rawValue()) + "pt"_L1);
    }
    writer.writeEndElement();
    // start writing table-column style element
    if (format.columnWidthConstraints().size()) {
        // write table-column-properties for columns with constraints
        m_tableFormatsWithColWidthConstraints.insert(formatIndex); // needed for linking of columns to styles
        for (int colit = 0; colit < format.columnWidthConstraints().size(); ++colit) {
            writer.writeStartElement(styleNS, QString::fromLatin1("style"));
            writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                                  QString::fromLatin1("Table%1.%2").arg(formatIndex).arg(colit));
            writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table-column"));
            writer.writeEmptyElement(styleNS, QString::fromLatin1("table-column-properties"));
            QString columnWidth;
            if (format.columnWidthConstraints().at(colit).type() == QTextLength::PercentageLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "%"_L1;
            } else if (format.columnWidthConstraints().at(colit).type() == QTextLength::FixedLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "pt"_L1;
            } else {
                //!! HARD-CODING variableWidth Constraints to 100% / nr constraints
                columnWidth = QString::number(100 / format.columnWidthConstraints().size())
                                      + "%"_L1;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("column-width"), columnWidth);
            writer.writeEndElement();
        }
    }
}